

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_16_1_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 *puVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint uVar65;
  int iVar66;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint in_stack_00000008;
  v128 res_128;
  v256_conflict tap [8];
  int *sec_taps;
  int *pri_taps;
  int s2o2;
  int s2o1;
  int s1o2;
  int s1o1;
  int po2;
  int po1;
  v256_conflict min;
  v256_conflict max;
  v256_conflict cdef_large_value_mask;
  v256_conflict res;
  v256_conflict row;
  v256_conflict p3;
  v256_conflict p2;
  v256_conflict p1;
  v256_conflict p0;
  v256_conflict sum;
  int i;
  int clipping_required;
  uint16_t *dst16;
  uint8_t *dst8;
  v128 res_128_1;
  v256_conflict tap_2 [8];
  v256_conflict tap_1 [4];
  int i_1;
  int *sec_taps_1;
  int *pri_taps_1;
  int s2o2_1;
  int s2o1_1;
  int s1o2_1;
  int s1o1_1;
  int po2_1;
  int po1_1;
  v256_conflict cdef_large_value_mask_1;
  v256_conflict min_1;
  v256_conflict max_1;
  v256_conflict res_1;
  v256_conflict row_1;
  v256_conflict sum_1;
  v256_conflict p3_1;
  v256_conflict p2_1;
  v256_conflict p1_1;
  v256_conflict p0_1;
  int clipping_required_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  v256_conflict s_15;
  v256_conflict sign_15;
  v256_conflict diff_15;
  v256_conflict s_14;
  v256_conflict sign_14;
  v256_conflict diff_14;
  v256_conflict s_13;
  v256_conflict sign_13;
  v256_conflict diff_13;
  v256_conflict s_12;
  v256_conflict sign_12;
  v256_conflict diff_12;
  v256_conflict s_23;
  v256_conflict sign_23;
  v256_conflict diff_23;
  v256_conflict s_22;
  v256_conflict sign_22;
  v256_conflict diff_22;
  v256_conflict s_21;
  v256_conflict sign_21;
  v256_conflict diff_21;
  v256_conflict s_20;
  v256_conflict sign_20;
  v256_conflict diff_20;
  v256_conflict s_19;
  v256_conflict sign_19;
  v256_conflict diff_19;
  v256_conflict s_18;
  v256_conflict sign_18;
  v256_conflict diff_18;
  v256_conflict s_17;
  v256_conflict sign_17;
  v256_conflict diff_17;
  v256_conflict s_16;
  v256_conflict sign_16;
  v256_conflict diff_16;
  v256_conflict s_3;
  v256_conflict sign_3;
  v256_conflict diff_3;
  v256_conflict s_2;
  v256_conflict sign_2;
  v256_conflict diff_2;
  v256_conflict s_1;
  v256_conflict sign_1;
  v256_conflict diff_1;
  v256_conflict s;
  v256_conflict sign;
  v256_conflict diff;
  v256_conflict s_11;
  v256_conflict sign_11;
  v256_conflict diff_11;
  v256_conflict s_10;
  v256_conflict sign_10;
  v256_conflict diff_10;
  v256_conflict s_9;
  v256_conflict sign_9;
  v256_conflict diff_9;
  v256_conflict s_8;
  v256_conflict sign_8;
  v256_conflict diff_8;
  v256_conflict s_7;
  v256_conflict sign_7;
  v256_conflict diff_7;
  v256_conflict s_6;
  v256_conflict sign_6;
  v256_conflict diff_6;
  v256_conflict s_5;
  v256_conflict sign_5;
  v256_conflict diff_5;
  v256_conflict s_4;
  v256_conflict sign_4;
  v256_conflict diff_4;
  v256_conflict max_u8_2;
  v256_conflict max_u8;
  v256_conflict max_u8_3;
  v256_conflict max_u8_1;
  uint local_e2a0;
  uint local_e260;
  undefined8 local_e080;
  undefined8 uStack_e078;
  undefined8 *puStack_e068;
  undefined8 uStack_e050;
  undefined8 uStack_e048;
  int local_df90;
  uint local_df60;
  int local_dccc;
  undefined8 uStack_dc10;
  undefined8 uStack_dc08;
  uint local_db20;
  undefined8 local_dad0;
  undefined8 uStack_dac8;
  undefined8 local_d970;
  undefined8 uStack_d968;
  undefined8 local_d940;
  undefined8 uStack_d938;
  undefined8 local_d910;
  undefined8 uStack_d908;
  undefined8 local_d8e0;
  undefined8 uStack_d8d8;
  ulong local_d6e0;
  ulong uStack_d6d8;
  ulong uStack_d6d0;
  ulong uStack_d6c8;
  ulong local_d600;
  ulong uStack_d5f8;
  ulong uStack_d5f0;
  ulong uStack_d5e8;
  ulong local_d520;
  ulong uStack_d518;
  ulong uStack_d510;
  ulong uStack_d508;
  ulong local_d440;
  ulong uStack_d438;
  ulong uStack_d430;
  ulong uStack_d428;
  ulong local_cc60;
  ulong uStack_cc58;
  ulong uStack_cc50;
  ulong uStack_cc48;
  ulong local_cb80;
  ulong uStack_cb78;
  ulong uStack_cb70;
  ulong uStack_cb68;
  ulong local_caa0;
  ulong uStack_ca98;
  ulong uStack_ca90;
  ulong uStack_ca88;
  ulong local_c9c0;
  ulong uStack_c9b8;
  ulong uStack_c9b0;
  ulong uStack_c9a8;
  ushort local_c964;
  undefined8 local_93c0;
  undefined8 local_9380;
  undefined8 local_9340;
  undefined8 local_9300;
  undefined1 local_9210 [16];
  undefined8 local_9160;
  undefined8 uStack_9158;
  ulong uStack_9078;
  ulong uStack_9038;
  ulong local_72c0;
  ulong uStack_72b8;
  ulong uStack_72b0;
  ulong uStack_72a8;
  ulong local_7280;
  ulong uStack_7278;
  ulong uStack_7270;
  ulong uStack_7268;
  ulong local_7240;
  ulong uStack_7238;
  ulong uStack_7230;
  ulong uStack_7228;
  ulong local_7200;
  ulong uStack_71f8;
  ulong uStack_71f0;
  ulong uStack_71e8;
  ulong local_6fc0;
  ulong uStack_6fb8;
  ulong uStack_6fb0;
  ulong uStack_6fa8;
  ulong local_6f80;
  ulong uStack_6f78;
  ulong uStack_6f70;
  ulong uStack_6f68;
  ulong local_6f40;
  ulong uStack_6f38;
  ulong uStack_6f30;
  ulong uStack_6f28;
  ulong local_6f00;
  ulong uStack_6ef8;
  ulong uStack_6ef0;
  ulong uStack_6ee8;
  ulong uStack_1d38;
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_c964 = (ushort)in_ECX;
  if (coeff_shift == 8) {
    local_df60 = in_stack_00000008;
    auVar68 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,2);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,3);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,4);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,5);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,6);
    vpinsrw_avx(auVar68,0xbfff,7);
    auVar68 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,2);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,3);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,4);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,5);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,6);
    vpinsrw_avx(auVar68,0xbfff,7);
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar4 = cdef_directions_padded[(long)in_R9D + 2][1];
    uVar65 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar66 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar66) < 0) {
        local_e260 = 0;
      }
      else {
        iVar66 = get_msb(in_ECX);
        local_e260 = in_stack_00000008 - iVar66;
      }
      local_df60 = local_e260;
    }
    for (local_df90 = 0; local_df90 < block_width; local_df90 = local_df90 + 2) {
      auVar68 = *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90) * 2);
      auVar67 = ZEXT116(0) * auVar68 +
                ZEXT116(1) * *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + 0x90) * 2);
      auVar68 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
      uStack_e050 = auVar68._0_8_;
      uStack_e048 = auVar68._8_8_;
      auVar68 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar3) * 2));
      auVar5 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar3) * 2));
      local_d8e0 = auVar68._0_8_;
      uStack_d8d8 = auVar68._8_8_;
      auVar68 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar3) * 2));
      auVar69 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar3) + 0x90) * 2));
      local_d910 = auVar68._0_8_;
      uStack_d908 = auVar68._8_8_;
      auVar11._16_8_ = local_d8e0;
      auVar11._0_16_ = auVar5;
      auVar11._24_8_ = uStack_d8d8;
      auVar10._16_8_ = uStack_e050;
      auVar10._0_16_ = auVar67;
      auVar10._24_8_ = uStack_e048;
      auVar9 = vpsubw_avx2(auVar11,auVar10);
      auVar6 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_730 = auVar5._0_8_;
      uStack_728 = auVar5._8_8_;
      auVar7 = vpsrlw_avx2(auVar9,ZEXT416(local_df60));
      auVar29._16_8_ = uStack_730;
      auVar29._0_16_ = auVar68;
      auVar29._24_8_ = uStack_728;
      auVar7 = vpsubusw_avx2(auVar29,auVar7);
      local_c9c0 = auVar6._0_8_;
      uStack_c9b8 = auVar6._8_8_;
      uStack_c9b0 = auVar6._16_8_;
      uStack_c9a8 = auVar6._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar7);
      auVar9 = vpaddw_avx2(auVar6,auVar9);
      local_72c0 = auVar9._0_8_;
      uStack_72b8 = auVar9._8_8_;
      uStack_72b0 = auVar9._16_8_;
      uStack_72a8 = auVar9._24_8_;
      auVar13._16_8_ = local_d910;
      auVar13._0_16_ = auVar69;
      auVar13._24_8_ = uStack_d908;
      auVar12._16_8_ = uStack_e050;
      auVar12._0_16_ = auVar67;
      auVar12._24_8_ = uStack_e048;
      auVar9 = vpsubw_avx2(auVar13,auVar12);
      auVar6 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_6f0 = auVar5._0_8_;
      uStack_6e8 = auVar5._8_8_;
      auVar7 = vpsrlw_avx2(auVar9,ZEXT416(local_df60));
      auVar28._16_8_ = uStack_6f0;
      auVar28._0_16_ = auVar68;
      auVar28._24_8_ = uStack_6e8;
      auVar7 = vpsubusw_avx2(auVar28,auVar7);
      local_caa0 = auVar6._0_8_;
      uStack_ca98 = auVar6._8_8_;
      uStack_ca90 = auVar6._16_8_;
      uStack_ca88 = auVar6._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar7);
      auVar9 = vpaddw_avx2(auVar6,auVar9);
      local_7280 = auVar9._0_8_;
      uStack_7278 = auVar9._8_8_;
      uStack_7270 = auVar9._16_8_;
      uStack_7268 = auVar9._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar65][0];
      auVar68 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,2);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,3);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,4);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,5);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,6);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,7);
      auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,7);
      uStack_230 = auVar5._0_8_;
      uStack_228 = auVar5._8_8_;
      auVar33._8_8_ = uStack_72b8 ^ uStack_c9b8;
      auVar33._0_8_ = local_72c0 ^ local_c9c0;
      auVar33._16_8_ = uStack_72b0 ^ uStack_c9b0;
      auVar33._24_8_ = uStack_72a8 ^ uStack_c9a8;
      auVar32._8_8_ = uStack_7278 ^ uStack_ca98;
      auVar32._0_8_ = local_7280 ^ local_caa0;
      auVar32._16_8_ = uStack_7270 ^ uStack_ca90;
      auVar32._24_8_ = uStack_7268 ^ uStack_ca88;
      auVar9 = vpaddw_avx2(auVar33,auVar32);
      auVar42._16_8_ = uStack_230;
      auVar42._0_16_ = auVar68;
      auVar42._24_8_ = uStack_228;
      auVar9 = vpmullw_avx2(auVar42,auVar9);
      auVar6 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar9);
      auVar68 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar4) * 2));
      auVar5 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar4) * 2));
      local_d940 = auVar68._0_8_;
      uStack_d938 = auVar68._8_8_;
      auVar68 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar4) * 2));
      auVar69 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar4) + 0x90) * 2));
      local_d970 = auVar68._0_8_;
      uStack_d968 = auVar68._8_8_;
      auVar15._16_8_ = local_d940;
      auVar15._0_16_ = auVar5;
      auVar15._24_8_ = uStack_d938;
      auVar14._16_8_ = uStack_e050;
      auVar14._0_16_ = auVar67;
      auVar14._24_8_ = uStack_e048;
      auVar9 = vpsubw_avx2(auVar15,auVar14);
      auVar7 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_6b0 = auVar5._0_8_;
      uStack_6a8 = auVar5._8_8_;
      auVar8 = vpsrlw_avx2(auVar9,ZEXT416(local_df60));
      auVar27._16_8_ = uStack_6b0;
      auVar27._0_16_ = auVar68;
      auVar27._24_8_ = uStack_6a8;
      auVar8 = vpsubusw_avx2(auVar27,auVar8);
      local_cb80 = auVar7._0_8_;
      uStack_cb78 = auVar7._8_8_;
      uStack_cb70 = auVar7._16_8_;
      uStack_cb68 = auVar7._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar8);
      auVar9 = vpaddw_avx2(auVar7,auVar9);
      local_7240 = auVar9._0_8_;
      uStack_7238 = auVar9._8_8_;
      uStack_7230 = auVar9._16_8_;
      uStack_7228 = auVar9._24_8_;
      auVar17._16_8_ = local_d970;
      auVar17._0_16_ = auVar69;
      auVar17._24_8_ = uStack_d968;
      auVar16._16_8_ = uStack_e050;
      auVar16._0_16_ = auVar67;
      auVar16._24_8_ = uStack_e048;
      auVar9 = vpsubw_avx2(auVar17,auVar16);
      auVar7 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_670 = auVar5._0_8_;
      uStack_668 = auVar5._8_8_;
      auVar8 = vpsrlw_avx2(auVar9,ZEXT416(local_df60));
      auVar26._16_8_ = uStack_670;
      auVar26._0_16_ = auVar68;
      auVar26._24_8_ = uStack_668;
      auVar8 = vpsubusw_avx2(auVar26,auVar8);
      local_cc60 = auVar7._0_8_;
      uStack_cc58 = auVar7._8_8_;
      uStack_cc50 = auVar7._16_8_;
      uStack_cc48 = auVar7._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar8);
      auVar9 = vpaddw_avx2(auVar7,auVar9);
      local_7200 = auVar9._0_8_;
      uStack_71f8 = auVar9._8_8_;
      uStack_71f0 = auVar9._16_8_;
      uStack_71e8 = auVar9._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar65][1];
      auVar68 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,2);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,3);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,4);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,5);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,6);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,7);
      auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,7);
      auVar69 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
      uStack_1f0 = auVar69._0_8_;
      uStack_1e8 = auVar69._8_8_;
      auVar35._8_8_ = uStack_7238 ^ uStack_cb78;
      auVar35._0_8_ = local_7240 ^ local_cb80;
      auVar35._16_8_ = uStack_7230 ^ uStack_cb70;
      auVar35._24_8_ = uStack_7228 ^ uStack_cb68;
      auVar34._8_8_ = uStack_71f8 ^ uStack_cc58;
      auVar34._0_8_ = local_7200 ^ local_cc60;
      auVar34._16_8_ = uStack_71f0 ^ uStack_cc50;
      auVar34._24_8_ = uStack_71e8 ^ uStack_cc48;
      auVar9 = vpaddw_avx2(auVar35,auVar34);
      auVar43._16_8_ = uStack_1f0;
      auVar43._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar5;
      auVar43._24_8_ = uStack_1e8;
      auVar9 = vpmullw_avx2(auVar43,auVar9);
      auVar9 = vpaddw_avx2(auVar6,auVar9);
      uStack_9078 = SUB328(ZEXT832(0),4);
      auVar6 = vpcmpgtw_avx2(ZEXT832(uStack_9078) << 0x40,auVar9);
      auVar9 = vpaddw_avx2(auVar9,auVar6);
      auVar68 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar68 = vpinsrw_avx(auVar68,8,2);
      auVar68 = vpinsrw_avx(auVar68,8,3);
      auVar68 = vpinsrw_avx(auVar68,8,4);
      auVar68 = vpinsrw_avx(auVar68,8,5);
      auVar68 = vpinsrw_avx(auVar68,8,6);
      auVar68 = vpinsrw_avx(auVar68,8,7);
      auVar5 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar5 = vpinsrw_avx(auVar5,8,2);
      auVar5 = vpinsrw_avx(auVar5,8,3);
      auVar5 = vpinsrw_avx(auVar5,8,4);
      auVar5 = vpinsrw_avx(auVar5,8,5);
      auVar5 = vpinsrw_avx(auVar5,8,6);
      auVar5 = vpinsrw_avx(auVar5,8,7);
      auVar69 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
      uStack_2f0 = auVar69._0_8_;
      uStack_2e8 = auVar69._8_8_;
      auVar30._16_8_ = uStack_2f0;
      auVar30._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar5;
      auVar30._24_8_ = uStack_2e8;
      auVar9 = vpaddw_avx2(auVar9,auVar30);
      auVar9 = vpsraw_avx2(auVar9,ZEXT416(4));
      auVar31._16_8_ = uStack_e050;
      auVar31._0_16_ = auVar67;
      auVar31._24_8_ = uStack_e048;
      auVar9 = vpaddw_avx2(auVar31,auVar9);
      local_e080 = auVar9._0_8_;
      uStack_e078 = auVar9._8_8_;
      puStack_e068 = auVar9._24_8_;
      *puStack_e068 = local_dad0;
      puStack_e068[1] = uStack_dac8;
      puVar1 = (undefined8 *)(in_RDI + (long)((local_df90 + 1) * in_ESI) * 2);
      *puVar1 = local_e080;
      puVar1[1] = uStack_e078;
    }
  }
  else {
    local_db20 = in_stack_00000008;
    auVar68 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,2);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,3);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,4);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,5);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,6);
    vpinsrw_avx(auVar68,0xbfff,7);
    auVar68 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,2);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,3);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,4);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,5);
    auVar68 = vpinsrw_avx(auVar68,0xbfff,6);
    vpinsrw_avx(auVar68,0xbfff,7);
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar4 = cdef_directions_padded[(long)in_R9D + 2][1];
    uVar65 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar66 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar66) < 0) {
        local_e2a0 = 0;
      }
      else {
        iVar66 = get_msb(in_ECX);
        local_e2a0 = in_stack_00000008 - iVar66;
      }
      local_db20 = local_e2a0;
    }
    for (local_dccc = 0; local_dccc < block_width; local_dccc = local_dccc + 4) {
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90) * 2);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90) * 2);
      auVar68 = vpunpcklqdq_avx(auVar46,auVar67);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0) * 2);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120) * 2);
      auVar5 = vpunpcklqdq_avx(auVar69,auVar5);
      auVar69 = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar5;
      auVar68 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
      uStack_dc10 = auVar68._0_8_;
      uStack_dc08 = auVar68._8_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar3) * 2);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar3) * 2);
      auVar68 = vpunpcklqdq_avx(auVar50,auVar49);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar3) * 2);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar3) * 2);
      auVar5 = vpunpcklqdq_avx(auVar48,auVar47);
      local_1b60 = auVar68._0_8_;
      uStack_1b58 = auVar68._8_8_;
      auVar6._16_8_ = local_1b60;
      auVar6._0_16_ = auVar5;
      auVar6._24_8_ = uStack_1b58;
      auVar9._16_8_ = uStack_dc10;
      auVar9._0_16_ = auVar69;
      auVar9._24_8_ = uStack_dc08;
      auVar9 = vpsubw_avx2(auVar6,auVar9);
      auVar6 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_430 = auVar5._0_8_;
      uStack_428 = auVar5._8_8_;
      auVar7 = vpsrlw_avx2(auVar9,ZEXT416(local_db20));
      auVar25._16_8_ = uStack_430;
      auVar25._0_16_ = auVar68;
      auVar25._24_8_ = uStack_428;
      auVar7 = vpsubusw_avx2(auVar25,auVar7);
      local_d440 = auVar6._0_8_;
      uStack_d438 = auVar6._8_8_;
      uStack_d430 = auVar6._16_8_;
      uStack_d428 = auVar6._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar7);
      auVar9 = vpaddw_avx2(auVar6,auVar9);
      local_6fc0 = auVar9._0_8_;
      uStack_6fb8 = auVar9._8_8_;
      uStack_6fb0 = auVar9._16_8_;
      uStack_6fa8 = auVar9._24_8_;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x90) * 2);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar3) * 2);
      auVar68 = vpunpcklqdq_avx(auVar54,auVar53);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x1b0) * 2);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x120) * 2);
      auVar5 = vpunpcklqdq_avx(auVar52,auVar51);
      local_1bd0 = auVar68._0_8_;
      uStack_1bc8 = auVar68._8_8_;
      auVar8._16_8_ = local_1bd0;
      auVar8._0_16_ = auVar5;
      auVar8._24_8_ = uStack_1bc8;
      auVar7._16_8_ = uStack_dc10;
      auVar7._0_16_ = auVar69;
      auVar7._24_8_ = uStack_dc08;
      auVar9 = vpsubw_avx2(auVar8,auVar7);
      auVar6 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_3f0 = auVar5._0_8_;
      uStack_3e8 = auVar5._8_8_;
      auVar7 = vpsrlw_avx2(auVar9,ZEXT416(local_db20));
      auVar24._16_8_ = uStack_3f0;
      auVar24._0_16_ = auVar68;
      auVar24._24_8_ = uStack_3e8;
      auVar7 = vpsubusw_avx2(auVar24,auVar7);
      local_d520 = auVar6._0_8_;
      uStack_d518 = auVar6._8_8_;
      uStack_d510 = auVar6._16_8_;
      uStack_d508 = auVar6._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar7);
      auVar9 = vpaddw_avx2(auVar6,auVar9);
      local_6f80 = auVar9._0_8_;
      uStack_6f78 = auVar9._8_8_;
      uStack_6f70 = auVar9._16_8_;
      uStack_6f68 = auVar9._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar65][0];
      auVar68 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,2);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,3);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,4);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,5);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,6);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,7);
      auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,7);
      uStack_b0 = auVar5._0_8_;
      uStack_a8 = auVar5._8_8_;
      auVar39._8_8_ = uStack_6fb8 ^ uStack_d438;
      auVar39._0_8_ = local_6fc0 ^ local_d440;
      auVar39._16_8_ = uStack_6fb0 ^ uStack_d430;
      auVar39._24_8_ = uStack_6fa8 ^ uStack_d428;
      auVar38._8_8_ = uStack_6f78 ^ uStack_d518;
      auVar38._0_8_ = local_6f80 ^ local_d520;
      auVar38._16_8_ = uStack_6f70 ^ uStack_d510;
      auVar38._24_8_ = uStack_6f68 ^ uStack_d508;
      auVar9 = vpaddw_avx2(auVar39,auVar38);
      auVar44._16_8_ = uStack_b0;
      auVar44._0_16_ = auVar68;
      auVar44._24_8_ = uStack_a8;
      auVar9 = vpmullw_avx2(auVar44,auVar9);
      auVar6 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar9);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar4) * 2);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar4) * 2);
      auVar68 = vpunpcklqdq_avx(auVar58,auVar57);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar4) * 2);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar4) * 2);
      auVar5 = vpunpcklqdq_avx(auVar56,auVar55);
      local_1c40 = auVar68._0_8_;
      uStack_1c38 = auVar68._8_8_;
      auVar19._16_8_ = local_1c40;
      auVar19._0_16_ = auVar5;
      auVar19._24_8_ = uStack_1c38;
      auVar18._16_8_ = uStack_dc10;
      auVar18._0_16_ = auVar69;
      auVar18._24_8_ = uStack_dc08;
      auVar9 = vpsubw_avx2(auVar19,auVar18);
      auVar7 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_3b0 = auVar5._0_8_;
      uStack_3a8 = auVar5._8_8_;
      auVar8 = vpsrlw_avx2(auVar9,ZEXT416(local_db20));
      auVar23._16_8_ = uStack_3b0;
      auVar23._0_16_ = auVar68;
      auVar23._24_8_ = uStack_3a8;
      auVar8 = vpsubusw_avx2(auVar23,auVar8);
      local_d600 = auVar7._0_8_;
      uStack_d5f8 = auVar7._8_8_;
      uStack_d5f0 = auVar7._16_8_;
      uStack_d5e8 = auVar7._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar8);
      auVar9 = vpaddw_avx2(auVar7,auVar9);
      local_6f40 = auVar9._0_8_;
      uStack_6f38 = auVar9._8_8_;
      uStack_6f30 = auVar9._16_8_;
      uStack_6f28 = auVar9._24_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x90) * 2);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar4) * 2);
      auVar68 = vpunpcklqdq_avx(auVar62,auVar61);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x1b0) * 2);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x120) * 2);
      auVar5 = vpunpcklqdq_avx(auVar60,auVar59);
      local_1cb0 = auVar68._0_8_;
      uStack_1ca8 = auVar68._8_8_;
      auVar21._16_8_ = local_1cb0;
      auVar21._0_16_ = auVar5;
      auVar21._24_8_ = uStack_1ca8;
      auVar20._16_8_ = uStack_dc10;
      auVar20._0_16_ = auVar69;
      auVar20._24_8_ = uStack_dc08;
      auVar9 = vpsubw_avx2(auVar21,auVar20);
      auVar7 = vpsraw_avx2(auVar9,ZEXT416(0xf));
      auVar9 = vpabsw_avx2(auVar9);
      auVar68 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,2);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,3);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,4);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,5);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,6);
      auVar68 = vpinsrw_avx(auVar68,in_ECX & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
      uStack_370 = auVar5._0_8_;
      uStack_368 = auVar5._8_8_;
      auVar8 = vpsrlw_avx2(auVar9,ZEXT416(local_db20));
      auVar22._16_8_ = uStack_370;
      auVar22._0_16_ = auVar68;
      auVar22._24_8_ = uStack_368;
      auVar8 = vpsubusw_avx2(auVar22,auVar8);
      local_d6e0 = auVar7._0_8_;
      uStack_d6d8 = auVar7._8_8_;
      uStack_d6d0 = auVar7._16_8_;
      uStack_d6c8 = auVar7._24_8_;
      auVar9 = vpminsw_avx2(auVar9,auVar8);
      auVar9 = vpaddw_avx2(auVar7,auVar9);
      local_6f00 = auVar9._0_8_;
      uStack_6ef8 = auVar9._8_8_;
      uStack_6ef0 = auVar9._16_8_;
      uStack_6ee8 = auVar9._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar65][1];
      auVar68 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,2);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,3);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,4);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,5);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,6);
      auVar68 = vpinsrw_avx(auVar68,(uint)uVar2,7);
      auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
      auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,7);
      auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
      uStack_70 = auVar67._0_8_;
      uStack_68 = auVar67._8_8_;
      auVar41._8_8_ = uStack_6f38 ^ uStack_d5f8;
      auVar41._0_8_ = local_6f40 ^ local_d600;
      auVar41._16_8_ = uStack_6f30 ^ uStack_d5f0;
      auVar41._24_8_ = uStack_6f28 ^ uStack_d5e8;
      auVar40._8_8_ = uStack_6ef8 ^ uStack_d6d8;
      auVar40._0_8_ = local_6f00 ^ local_d6e0;
      auVar40._16_8_ = uStack_6ef0 ^ uStack_d6d0;
      auVar40._24_8_ = uStack_6ee8 ^ uStack_d6c8;
      auVar9 = vpaddw_avx2(auVar41,auVar40);
      auVar45._16_8_ = uStack_70;
      auVar45._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar5;
      auVar45._24_8_ = uStack_68;
      auVar9 = vpmullw_avx2(auVar45,auVar9);
      auVar9 = vpaddw_avx2(auVar6,auVar9);
      uStack_9038 = SUB328(ZEXT832(0),4);
      auVar6 = vpcmpgtw_avx2(ZEXT832(uStack_9038) << 0x40,auVar9);
      auVar9 = vpaddw_avx2(auVar9,auVar6);
      auVar68 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar68 = vpinsrw_avx(auVar68,8,2);
      auVar68 = vpinsrw_avx(auVar68,8,3);
      auVar68 = vpinsrw_avx(auVar68,8,4);
      auVar68 = vpinsrw_avx(auVar68,8,5);
      auVar68 = vpinsrw_avx(auVar68,8,6);
      auVar68 = vpinsrw_avx(auVar68,8,7);
      auVar5 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar5 = vpinsrw_avx(auVar5,8,2);
      auVar5 = vpinsrw_avx(auVar5,8,3);
      auVar5 = vpinsrw_avx(auVar5,8,4);
      auVar5 = vpinsrw_avx(auVar5,8,5);
      auVar5 = vpinsrw_avx(auVar5,8,6);
      auVar5 = vpinsrw_avx(auVar5,8,7);
      auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
      uStack_170 = auVar67._0_8_;
      uStack_168 = auVar67._8_8_;
      auVar36._16_8_ = uStack_170;
      auVar36._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar5;
      auVar36._24_8_ = uStack_168;
      auVar9 = vpaddw_avx2(auVar9,auVar36);
      auVar9 = vpsraw_avx2(auVar9,ZEXT416(4));
      auVar37._16_8_ = uStack_dc10;
      auVar37._0_16_ = auVar69;
      auVar37._24_8_ = uStack_dc08;
      auVar9 = vpaddw_avx2(auVar37,auVar9);
      auVar68 = vpsrldq_avx(local_9210,8);
      local_9300 = auVar68._0_8_;
      *(undefined8 *)(in_RDI + (long)(local_dccc * in_ESI) * 2) = local_9300;
      uStack_1d38 = SUB168(ZEXT816(0),4);
      auVar68._8_8_ = uStack_9158;
      auVar68._0_8_ = local_9160;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uStack_1d38;
      auVar68 = vpunpcklqdq_avx(auVar68,auVar63 << 0x40);
      local_9340 = auVar68._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 1) * in_ESI) * 2) = local_9340;
      auVar68 = vpsrldq_avx(auVar9._0_16_,8);
      local_9380 = auVar68._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 2) * in_ESI) * 2) = local_9380;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uStack_1d38;
      auVar68 = vpunpcklqdq_avx(auVar9._0_16_,auVar64 << 0x40);
      local_93c0 = auVar68._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 3) * in_ESI) * 2) = local_93c0;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_1)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}